

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O1

void __thiscall
script_standard_tests::script_standard_ExtractDestination::test_method
          (script_standard_ExtractDestination *this)

{
  undefined4 uVar1;
  uint uVar2;
  CScript *data;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _func_int **pp_Var6;
  bool bVar7;
  readonly_property<bool> rVar8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar9;
  variant_alternative_t<1UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *a;
  variant_alternative_t<2UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *pvVar10;
  allocator_type *paVar11;
  variant_alternative_t<5UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *pvVar12;
  CSHA256 *this_00;
  variant_alternative_t<4UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *pvVar13;
  pointer __dest;
  variant_alternative_t<8UL,_variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *w1;
  undefined8 uVar14;
  uint uVar15;
  size_t len;
  ulong uVar16;
  size_type sVar17;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar18;
  iterator in_R8;
  iterator pvVar19;
  iterator in_R9;
  iterator pvVar20;
  size_t __n;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file_01;
  const_string file_02;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_03;
  const_string file_04;
  span<const_std::byte,_18446744073709551615UL> b_02;
  const_string file_05;
  initializer_list<unsigned_char> __l;
  span<const_std::byte,_18446744073709551615UL> b_03;
  const_string file_06;
  span<const_std::byte,_18446744073709551615UL> b_04;
  const_string file_07;
  Span<unsigned_char> output;
  const_string file_08;
  span<const_std::byte,_18446744073709551615UL> b_05;
  const_string file_09;
  const_string file_10;
  span<const_std::byte,_18446744073709551615UL> b_06;
  const_string file_11;
  const_string file_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  CKey key;
  WitnessV0ScriptHash scripthash;
  WitnessUnknown unk;
  WitnessV0KeyHash keyhash;
  CScript redeemScript;
  CTxDestination address;
  CScript s;
  CPubKey pubkey;
  check_type cVar29;
  char *local_4b0;
  char *local_4a8;
  assertion_result local_4a0;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 local_1f8 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_1f0;
  undefined1 local_1e8 [2];
  allocator_type aStack_1e6;
  allocator_type aStack_1e5;
  allocator_type aStack_1e4;
  allocator_type aStack_1e3;
  allocator_type aStack_1e2;
  allocator_type aStack_1e1;
  undefined1 auStack_1e0 [2];
  allocator_type aStack_1de;
  allocator_type aStack_1dd;
  allocator_type aStack_1dc;
  allocator_type aStack_1db;
  allocator_type aStack_1da;
  allocator_type aStack_1d9;
  shared_count local_1d8;
  char **local_1d0;
  assertion_result local_1c8;
  uchar uStack_1b0;
  uchar uStack_1af;
  uchar uStack_1ae;
  uchar uStack_1ad;
  uchar uStack_1ac;
  uchar uStack_1ab;
  uchar uStack_1aa;
  uchar uStack_1a9;
  undefined1 local_1a8 [8];
  bool bStack_1a0;
  undefined7 uStack_19f;
  pointer local_198;
  assertion_result *paStack_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint64_t local_148;
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined1 local_118 [16];
  shared_count sStack_108;
  undefined8 local_100;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_f8;
  undefined1 local_b0;
  undefined1 local_a8 [28];
  uint uStack_8c;
  CPubKey local_79;
  long local_38;
  
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)local_4a0.m_message.px;
  local_1d8.pi_ = (sp_counted_base *)_auStack_1e0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81((CKey *)local_1f8,0));
  CKey::GetPubKey(&local_79,(CKey *)local_1f8);
  stack0xffffffffffffff68 = (undefined1  [16])0x0;
  local_a8._0_16_ = (undefined1  [16])0x0;
  local_f8._16_16_ = (undefined1  [16])0x0;
  local_f8._0_16_ = (undefined1  [16])0x0;
  local_b0 = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar17 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar17 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar17);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,&local_79);
  b._M_extent._M_extent_value =
       CONCAT71(uStack_19f,bStack_1a0) - (long)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  b._M_ptr = (pointer)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  ppVar9 = &CScript::operator<<((CScript *)local_a8,b)->super_CScriptBase;
  uVar15 = ppVar9->_size;
  uVar2 = uVar15 - 0x1d;
  if (uVar15 < 0x1d) {
    uVar2 = uVar15;
  }
  ppVar18 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar9->_union).indirect_contents.indirect;
  if (uVar15 < 0x1d) {
    ppVar18 = ppVar9;
  }
  local_118[0] = (readonly_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar9,(uchar *)((long)&ppVar18->_union + (long)(int)uVar2),local_118);
  pvVar3 = (void *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_198 - (long)pvVar3);
  }
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xe5;
  file.m_begin = (iterator)&local_208;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_218,msg);
  bVar7 = ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  local_118[0] = !bVar7;
  local_118._8_8_ = (element_type *)0x0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  paStack_190 = &local_1c8;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xd8;
  local_1c8._1_1_ = 0x6f;
  local_1c8._2_1_ = 0xec;
  local_1c8._3_1_ = 0;
  local_1c8._4_1_ = 0;
  local_1c8._5_1_ = 0;
  local_1c8._6_1_ = 0;
  local_1c8._7_1_ = 0;
  local_1c8.m_message.px._0_1_ = 0xf7;
  local_1c8.m_message.px._1_1_ = 0x6f;
  local_1c8.m_message.px._2_1_ = 0xec;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  bStack_1a0 = false;
  local_1a8._0_4_ = 0x13abc70;
  local_1a8._4_4_ = 0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_220 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_118,(lazy_ostream *)local_1a8,1,0,WARN,_cVar29,
             (size_t)&local_228,0xe5);
  boost::detail::shared_count::~shared_count((shared_count *)(local_118 + 0x10));
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xe6;
  file_00.m_begin = (iterator)&local_238;
  msg_00.m_end = pvVar20;
  msg_00.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_248,
             msg_00);
  a = std::
      get<1ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)&local_f8._M_first);
  memcpy((CPubKey *)local_1a8,&local_79,0x41);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)::operator==(&a->m_pubkey,(CPubKey *)local_1a8);
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = '\0';
  local_1c8.m_message.pn.pi_._1_1_ = '\0';
  local_1c8.m_message.pn.pi_._2_1_ = '\0';
  local_1c8.m_message.pn.pi_._3_1_ = '\0';
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  _local_1e8 = (undefined **)0xec6ff8;
  _auStack_1e0 = (element_type *)0xec7039;
  local_118._8_8_ = local_118._9_8_ << 8;
  local_118._0_8_ = &PTR__lazy_ostream_013abc70;
  sStack_108.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_250 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  local_100 = local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_118,1,0,WARN,_cVar29,(size_t)&local_258,0xe6);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar17 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar17 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar17);
  uVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar15 = uStack_8c;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x76;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar9->_union + (long)(int)uVar15),local_1a8);
  uVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar15 = uStack_8c;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0xa9;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar9->_union + (long)(int)uVar15),local_1a8);
  CPubKey::GetID((CKeyID *)local_118,&local_79);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1a8,local_118,
             (uchar *)((long)&sStack_108.pi_ + 4),(allocator_type *)&local_1c8);
  b_00._M_extent._M_extent_value =
       CONCAT71(uStack_19f,bStack_1a0) - (long)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  b_00._M_ptr = (pointer)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  ppVar9 = &CScript::operator<<((CScript *)local_a8,b_00)->super_CScriptBase;
  uVar15 = ppVar9->_size;
  uVar2 = uVar15 - 0x1d;
  if (uVar15 < 0x1d) {
    uVar2 = uVar15;
  }
  ppVar18 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar9->_union).indirect_contents.indirect;
  if (uVar15 < 0x1d) {
    ppVar18 = ppVar9;
  }
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x88;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar9,(uchar *)((long)&ppVar18->_union + (long)(int)uVar2),(uchar *)&local_1c8);
  uVar15 = ppVar9->_size;
  uVar2 = uVar15 - 0x1d;
  if (uVar15 < 0x1d) {
    uVar2 = uVar15;
  }
  ppVar18 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar9->_union).indirect_contents.indirect;
  if (uVar15 < 0x1d) {
    ppVar18 = ppVar9;
  }
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar9,(uchar *)((long)&ppVar18->_union + (long)(int)uVar2),(uchar *)&local_1c8);
  pvVar3 = (void *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_198 - (long)pvVar3);
  }
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xeb;
  file_01.m_begin = (iterator)&local_268;
  msg_01.m_end = pvVar20;
  msg_01.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_278,
             msg_01);
  rVar8.super_class_property<bool>.value =
       (class_property<bool>)
       ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  local_118._8_8_ = (element_type *)0x0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xd9;
  local_1c8._1_1_ = 'o';
  local_1c8._2_1_ = 0xec;
  local_1c8._3_1_ = '\0';
  local_1c8._4_1_ = '\0';
  local_1c8._5_1_ = '\0';
  local_1c8._6_1_ = '\0';
  local_1c8._7_1_ = '\0';
  local_1c8.m_message.px._0_1_ = 0xf7;
  local_1c8.m_message.px._1_1_ = 'o';
  local_1c8.m_message.px._2_1_ = 0xec;
  local_1c8.m_message.px._3_1_ = '\0';
  local_1c8.m_message.px._4_1_ = '\0';
  local_1c8.m_message.px._5_1_ = '\0';
  local_1c8.m_message.px._6_1_ = '\0';
  local_1c8.m_message.px._7_1_ = '\0';
  bStack_1a0 = false;
  local_1a8._0_4_ = 0x13abc70;
  local_1a8._4_4_ = 0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_280 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  paStack_190 = &local_1c8;
  local_118[0] = rVar8.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_118,(lazy_ostream *)local_1a8,1,0,WARN,_cVar29,
             (size_t)&local_288,0xeb);
  boost::detail::shared_count::~shared_count((shared_count *)(local_118 + 0x10));
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xec;
  file_02.m_begin = (iterator)&local_298;
  msg_02.m_end = pvVar20;
  msg_02.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a8,
             msg_02);
  pvVar10 = std::
            get<2ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        *)&local_f8._M_first);
  PKHash::PKHash((PKHash *)&local_1c8,&local_79);
  uVar1 = *(undefined4 *)
           ((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 0x10);
  auVar21[0] = -((readonly_property<bool>)
                 (pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[0]
                == local_1c8.p_predicate_value.super_readonly_property<bool>.
                   super_class_property<bool>.value);
  auVar21[1] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[1]
                == local_1c8._1_1_);
  auVar21[2] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[2]
                == local_1c8._2_1_);
  auVar21[3] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[3]
                == local_1c8._3_1_);
  auVar21[4] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[4]
                == local_1c8._4_1_);
  auVar21[5] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[5]
                == local_1c8._5_1_);
  auVar21[6] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[6]
                == local_1c8._6_1_);
  auVar21[7] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[7]
                == local_1c8._7_1_);
  auVar21[8] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[8]
                == (uchar)local_1c8.m_message.px);
  auVar21[9] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[9]
                == local_1c8.m_message.px._1_1_);
  auVar21[10] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [10] == local_1c8.m_message.px._2_1_);
  auVar21[0xb] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xb] == local_1c8.m_message.px._3_1_);
  auVar21[0xc] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xc] == local_1c8.m_message.px._4_1_);
  auVar21[0xd] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xd] == local_1c8.m_message.px._5_1_);
  auVar21[0xe] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xe] == local_1c8.m_message.px._6_1_);
  auVar21[0xf] = -((pvVar10->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xf] == local_1c8.m_message.px._7_1_);
  auVar26[0] = -((uchar)local_1c8.m_message.pn.pi_ == (char)uVar1);
  auVar26[1] = -(local_1c8.m_message.pn.pi_._1_1_ == (char)((uint)uVar1 >> 8));
  auVar26[2] = -(local_1c8.m_message.pn.pi_._2_1_ == (char)((uint)uVar1 >> 0x10));
  auVar26[3] = -(local_1c8.m_message.pn.pi_._3_1_ == (char)((uint)uVar1 >> 0x18));
  auVar26[4] = 0xff;
  auVar26[5] = 0xff;
  auVar26[6] = 0xff;
  auVar26[7] = 0xff;
  auVar26[8] = 0xff;
  auVar26[9] = 0xff;
  auVar26[10] = 0xff;
  auVar26[0xb] = 0xff;
  auVar26[0xc] = 0xff;
  auVar26[0xd] = 0xff;
  auVar26[0xe] = 0xff;
  auVar26[0xf] = 0xff;
  auVar21 = auVar21 & auVar26;
  local_118[0] = (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff;
  local_118._8_8_ = (element_type *)0x0;
  sStack_108.pi_ = (sp_counted_base *)0x0;
  _local_1e8 = (undefined **)0xec703a;
  _auStack_1e0 = (element_type *)0xec7065;
  bStack_1a0 = false;
  local_1a8._0_4_ = 0x13abc70;
  local_1a8._4_4_ = 0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2b0 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  paStack_190 = (assertion_result *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_118,(lazy_ostream *)local_1a8,1,0,WARN,_cVar29,
             (size_t)&local_2b8,0xec);
  boost::detail::shared_count::~shared_count((shared_count *)(local_118 + 0x10));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_118,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar17 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar17 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar17);
  uVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar15 = uStack_8c;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0xa9;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar9->_union + (long)(int)uVar15),local_1a8);
  CScriptID::CScriptID((CScriptID *)&local_1c8,(CScript *)local_118);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1a8,(uchar *)&local_1c8,
             (uchar *)((long)&local_1c8.m_message.pn.pi_ + 4),(allocator_type *)local_1e8);
  b_01._M_extent._M_extent_value =
       CONCAT71(uStack_19f,bStack_1a0) - (long)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  b_01._M_ptr = (pointer)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  ppVar9 = &CScript::operator<<((CScript *)local_a8,b_01)->super_CScriptBase;
  uVar15 = ppVar9->_size;
  uVar2 = uVar15 - 0x1d;
  if (uVar15 < 0x1d) {
    uVar2 = uVar15;
  }
  ppVar18 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar9->_union).indirect_contents.indirect;
  if (uVar15 < 0x1d) {
    ppVar18 = ppVar9;
  }
  _local_1e8 = (undefined **)CONCAT71(stack0xfffffffffffffe19,(readonly_property<bool>)0x87);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar9,(uchar *)((long)&ppVar18->_union + (long)(int)uVar2),local_1e8);
  pvVar3 = (void *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_198 - (long)pvVar3);
  }
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xf2;
  file_03.m_begin = (iterator)&local_2c8;
  msg_03.m_end = pvVar20;
  msg_03.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8,
             msg_03);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = 0;
  local_1c8.m_message.pn.pi_._1_1_ = 0;
  local_1c8.m_message.pn.pi_._2_1_ = 0;
  local_1c8.m_message.pn.pi_._3_1_ = 0;
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  _local_1e8 = (undefined **)0xec6fd9;
  _auStack_1e0 = (element_type *)0xec6ff7;
  bStack_1a0 = false;
  local_1a8._0_4_ = 0x13abc70;
  local_1a8._4_4_ = 0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2e0 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  paStack_190 = (assertion_result *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar29,(size_t)&local_2e8,0xf2);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xf3;
  file_04.m_begin = (iterator)&local_2f8;
  msg_04.m_end = pvVar20;
  msg_04.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_308,
             msg_04);
  paVar11 = (allocator_type *)
            std::
            get<3ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        *)&local_f8._M_first);
  ScriptHash::ScriptHash((ScriptHash *)local_1e8,(CScript *)local_118);
  auVar24[0] = -(local_1e8[0] == (bool)*(class_property<bool> *)paVar11);
  auVar24[1] = -(local_1e8[1] == paVar11[1]);
  auVar24[2] = -(aStack_1e6 == paVar11[2]);
  auVar24[3] = -(aStack_1e5 == paVar11[3]);
  auVar24[4] = -(aStack_1e4 == paVar11[4]);
  auVar24[5] = -(aStack_1e3 == paVar11[5]);
  auVar24[6] = -(aStack_1e2 == paVar11[6]);
  auVar24[7] = -(aStack_1e1 == paVar11[7]);
  auVar24[8] = -(auStack_1e0[0] == paVar11[8]);
  auVar24[9] = -(auStack_1e0[1] == paVar11[9]);
  auVar24[10] = -(aStack_1de == paVar11[10]);
  auVar24[0xb] = -(aStack_1dd == paVar11[0xb]);
  auVar24[0xc] = -(aStack_1dc == paVar11[0xc]);
  auVar24[0xd] = -(aStack_1db == paVar11[0xd]);
  auVar24[0xe] = -(aStack_1da == paVar11[0xe]);
  auVar24[0xf] = -(aStack_1d9 == paVar11[0xf]);
  uVar1 = *(undefined4 *)(paVar11 + 0x10);
  auVar27[0] = -(auStack_1e0[8] == (char)uVar1);
  auVar27[1] = -(auStack_1e0[9] == (char)((uint)uVar1 >> 8));
  auVar27[2] = -(auStack_1e0[10] == (char)((uint)uVar1 >> 0x10));
  auVar27[3] = -(auStack_1e0[0xb] == (char)((uint)uVar1 >> 0x18));
  auVar27[4] = 0xff;
  auVar27[5] = 0xff;
  auVar27[6] = 0xff;
  auVar27[7] = 0xff;
  auVar27[8] = 0xff;
  auVar27[9] = 0xff;
  auVar27[10] = 0xff;
  auVar27[0xb] = 0xff;
  auVar27[0xc] = 0xff;
  auVar27[0xd] = 0xff;
  auVar27[0xe] = 0xff;
  auVar27[0xf] = 0xff;
  auVar27 = auVar27 & auVar24;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff);
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = 0;
  local_1c8.m_message.pn.pi_._1_1_ = 0;
  local_1c8.m_message.pn.pi_._2_1_ = 0;
  local_1c8.m_message.pn.pi_._3_1_ = 0;
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  paStack_190 = &local_4a0;
  local_4a0._0_8_ = "std::get<ScriptHash>(address) == ScriptHash(redeemScript)";
  local_4a0.m_message.px = (element_type *)0xec709f;
  bStack_1a0 = false;
  local_1a8._0_4_ = 0x13abc70;
  local_1a8._4_4_ = 0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_310 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar29,(size_t)&local_318,0xf3);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar17 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar17 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar17);
  uVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar15 = uStack_8c;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar9->_union + (long)(int)uVar15),local_1a8);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,&local_79);
  b_02._M_extent._M_extent_value =
       CONCAT71(uStack_19f,bStack_1a0) - (long)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  b_02._M_ptr = (pointer)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  ppVar9 = &CScript::operator<<((CScript *)local_a8,b_02)->super_CScriptBase;
  uVar15 = ppVar9->_size;
  uVar2 = uVar15 - 0x1d;
  if (uVar15 < 0x1d) {
    uVar2 = uVar15;
  }
  ppVar18 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar9->_union).indirect_contents.indirect;
  if (uVar15 < 0x1d) {
    ppVar18 = ppVar9;
  }
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar9,(uchar *)((long)&ppVar18->_union + (long)(int)uVar2),(uchar *)&local_1c8);
  uVar15 = ppVar9->_size;
  uVar2 = uVar15 - 0x1d;
  if (uVar15 < 0x1d) {
    uVar2 = uVar15;
  }
  ppVar18 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
            (ppVar9->_union).indirect_contents.indirect;
  if (uVar15 < 0x1d) {
    ppVar18 = ppVar9;
  }
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xae;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (ppVar9,(uchar *)((long)&ppVar18->_union + (long)(int)uVar2),(uchar *)&local_1c8);
  pvVar3 = (void *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_198 - (long)pvVar3);
  }
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xf8;
  file_05.m_begin = (iterator)&local_328;
  msg_05.m_end = pvVar20;
  msg_05.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_338,
             msg_05);
  bVar7 = ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar7;
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = 0;
  local_1c8.m_message.pn.pi_._1_1_ = 0;
  local_1c8.m_message.pn.pi_._2_1_ = 0;
  local_1c8.m_message.pn.pi_._3_1_ = 0;
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  _local_1e8 = (undefined **)0xec6fd8;
  _auStack_1e0 = (element_type *)0xec6ff7;
  bStack_1a0 = false;
  local_1a8._0_4_ = 0x13abc70;
  local_1a8._4_4_ = 0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_340 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  paStack_190 = (assertion_result *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar29,(size_t)&local_348,0xf8);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar17 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar17 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar17);
  uVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar15 = uStack_8c;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x6a;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar9->_union + (long)(int)uVar15),local_1a8);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x4b;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,__l,
             (allocator_type *)local_1e8);
  b_03._M_extent._M_extent_value =
       CONCAT71(uStack_19f,bStack_1a0) - (long)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  b_03._M_ptr = (pointer)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  CScript::operator<<((CScript *)local_a8,b_03);
  pvVar3 = (void *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_198 - (long)pvVar3);
  }
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xfd;
  file_06.m_begin = (iterator)&local_358;
  msg_06.m_end = pvVar20;
  msg_06.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_368,
             msg_06);
  bVar7 = ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar7;
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = 0;
  local_1c8.m_message.pn.pi_._1_1_ = 0;
  local_1c8.m_message.pn.pi_._2_1_ = 0;
  local_1c8.m_message.pn.pi_._3_1_ = 0;
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  _local_1e8 = (undefined **)0xec6fd8;
  _auStack_1e0 = (element_type *)0xec6ff7;
  bStack_1a0 = false;
  local_1a8._0_4_ = 0x13abc70;
  local_1a8._4_4_ = 0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_370 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  paStack_190 = (assertion_result *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar29,(size_t)&local_378,0xfd);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar17 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar17 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar17);
  uVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar15 = uStack_8c;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8._0_4_ = local_1a8._0_4_ & 0xffffff00;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar9->_union + (long)(int)uVar15),local_1a8);
  CPubKey::GetID((CKeyID *)&local_1c8,&local_79);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1a8,(uchar *)&local_1c8,
             (uchar *)((long)&local_1c8.m_message.pn.pi_ + 4),(allocator_type *)local_1e8);
  b_04._M_extent._M_extent_value =
       CONCAT71(uStack_19f,bStack_1a0) - (long)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  b_04._M_ptr = (pointer)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  CScript::operator<<((CScript *)local_a8,b_04);
  pvVar3 = (void *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_198 - (long)pvVar3);
  }
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x102;
  file_07.m_begin = (iterator)&local_388;
  msg_07.m_end = pvVar20;
  msg_07.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_398,
             msg_07);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = 0;
  local_1c8.m_message.pn.pi_._1_1_ = 0;
  local_1c8.m_message.pn.pi_._2_1_ = 0;
  local_1c8.m_message.pn.pi_._3_1_ = 0;
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  _local_1e8 = (undefined **)0xec6fd9;
  _auStack_1e0 = (element_type *)0xec6ff7;
  bStack_1a0 = false;
  local_1a8._0_4_ = 0x13abc70;
  local_1a8._4_4_ = 0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3a0 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  paStack_190 = (assertion_result *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar29,(size_t)&local_3a8,0x102);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_138 = (undefined1  [16])0x0;
  local_128 = 0;
  local_158 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_198 = (pointer)0x0;
  paStack_190 = (assertion_result *)0x0;
  local_1a8._0_4_ = 0;
  local_1a8._4_4_ = 0;
  bStack_1a0 = false;
  uStack_19f = 0;
  local_148 = 0;
  CSHA256::CSHA256((CSHA256 *)local_1a8);
  len = 0x21;
  if ((local_79.vch[0] & 0xfe) != 2) {
    if ((byte)(local_79.vch[0] - 4) < 4) {
      len = (&DAT_00e5ea00)[(byte)(local_79.vch[0] - 4)];
    }
    else {
      len = 0;
    }
  }
  CSHA256::Write((CSHA256 *)local_1a8,local_79.vch,len);
  output.m_size = 0x14;
  output.m_data = local_138;
  CHash160::Finalize((CHash160 *)local_1a8,output);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x105;
  file_08.m_begin = (iterator)&local_3b8;
  msg_08.m_end = pvVar20;
  msg_08.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3c8,
             msg_08);
  pvVar12 = std::
            get<5ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        *)&local_f8._M_first);
  uVar1 = *(undefined4 *)
           ((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 0x10);
  auVar22[0] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[0]
                == local_138[0]);
  auVar22[1] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[1]
                == local_138[1]);
  auVar22[2] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[2]
                == local_138[2]);
  auVar22[3] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[3]
                == local_138[3]);
  auVar22[4] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[4]
                == local_138[4]);
  auVar22[5] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[5]
                == local_138[5]);
  auVar22[6] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[6]
                == local_138[6]);
  auVar22[7] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[7]
                == local_138[7]);
  auVar22[8] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[8]
                == local_138[8]);
  auVar22[9] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems[9]
                == local_138[9]);
  auVar22[10] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                  [10] == local_138[10]);
  auVar22[0xb] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xb] == local_138[0xb]);
  auVar22[0xc] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xc] == local_138[0xc]);
  auVar22[0xd] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xd] == local_138[0xd]);
  auVar22[0xe] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xe] == local_138[0xe]);
  auVar22[0xf] = -((pvVar12->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
                   [0xf] == local_138[0xf]);
  auVar28[0] = -((char)local_128 == (char)uVar1);
  auVar28[1] = -((char)((uint)local_128 >> 8) == (char)((uint)uVar1 >> 8));
  auVar28[2] = -((char)((uint)local_128 >> 0x10) == (char)((uint)uVar1 >> 0x10));
  auVar28[3] = -((char)((uint)local_128 >> 0x18) == (char)((uint)uVar1 >> 0x18));
  auVar28[4] = 0xff;
  auVar28[5] = 0xff;
  auVar28[6] = 0xff;
  auVar28[7] = 0xff;
  auVar28[8] = 0xff;
  auVar28[9] = 0xff;
  auVar28[10] = 0xff;
  auVar28[0xb] = 0xff;
  auVar28[0xc] = 0xff;
  auVar28[0xd] = 0xff;
  auVar28[0xe] = 0xff;
  auVar28[0xf] = 0xff;
  auVar22 = auVar22 & auVar28;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff);
  local_1c8.m_message.px._0_1_ = 0;
  local_1c8.m_message.px._1_1_ = 0;
  local_1c8.m_message.px._2_1_ = 0;
  local_1c8.m_message.px._3_1_ = 0;
  local_1c8.m_message.px._4_1_ = 0;
  local_1c8.m_message.px._5_1_ = 0;
  local_1c8.m_message.px._6_1_ = 0;
  local_1c8.m_message.px._7_1_ = 0;
  local_1c8.m_message.pn.pi_._0_1_ = 0;
  local_1c8.m_message.pn.pi_._1_1_ = 0;
  local_1c8.m_message.pn.pi_._2_1_ = 0;
  local_1c8.m_message.pn.pi_._3_1_ = 0;
  local_1c8.m_message.pn.pi_._4_1_ = 0;
  local_1c8.m_message.pn.pi_._5_1_ = 0;
  local_1c8.m_message.pn.pi_._6_1_ = 0;
  local_1c8.m_message.pn.pi_._7_1_ = 0;
  _local_1e8 = (undefined **)0xec70a0;
  _auStack_1e0 = (element_type *)0xec70ce;
  bStack_1a0 = false;
  local_1a8._0_4_ = 0x13abc70;
  local_1a8._4_4_ = 0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3d0 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  paStack_190 = (assertion_result *)local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar29,(size_t)&local_3d8,0x105);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar17 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar17 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar17);
  local_1c8.m_message.pn.pi_._0_1_ = '\0';
  local_1c8.m_message.pn.pi_._1_1_ = '\0';
  local_1c8.m_message.pn.pi_._2_1_ = '\0';
  local_1c8.m_message.pn.pi_._3_1_ = '\0';
  local_1c8.m_message.pn.pi_._4_1_ = '\0';
  local_1c8.m_message.pn.pi_._5_1_ = '\0';
  local_1c8.m_message.pn.pi_._6_1_ = '\0';
  local_1c8.m_message.pn.pi_._7_1_ = '\0';
  uStack_1b0 = '\0';
  uStack_1af = '\0';
  uStack_1ae = '\0';
  uStack_1ad = '\0';
  uStack_1ac = '\0';
  uStack_1ab = '\0';
  uStack_1aa = '\0';
  uStack_1a9 = '\0';
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_1c8._1_1_ = '\0';
  local_1c8._2_1_ = '\0';
  local_1c8._3_1_ = '\0';
  local_1c8._4_1_ = '\0';
  local_1c8._5_1_ = '\0';
  local_1c8._6_1_ = '\0';
  local_1c8._7_1_ = '\0';
  local_1c8.m_message.px._0_1_ = '\0';
  local_1c8.m_message.px._1_1_ = '\0';
  local_1c8.m_message.px._2_1_ = '\0';
  local_1c8.m_message.px._3_1_ = '\0';
  local_1c8.m_message.px._4_1_ = '\0';
  local_1c8.m_message.px._5_1_ = '\0';
  local_1c8.m_message.px._6_1_ = '\0';
  local_1c8.m_message.px._7_1_ = '\0';
  CSHA256::CSHA256((CSHA256 *)local_1a8);
  uVar15 = local_100._4_4_ - 0x1d;
  data = (CScript *)local_118._0_8_;
  if (local_100._4_4_ < 0x1d) {
    uVar15 = local_100._4_4_;
    data = (CScript *)local_118;
  }
  this_00 = CSHA256::Write((CSHA256 *)local_1a8,(uchar *)data,(ulong)uVar15);
  CSHA256::Finalize(this_00,(uchar *)&local_1c8);
  uVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar15 = uStack_8c;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8._0_4_ = local_1a8._0_4_ & 0xffffff00;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar9->_union + (long)(int)uVar15),local_1a8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_1a8,(uchar *)&local_1c8,
             local_1a8,(allocator_type *)local_1e8);
  b_05._M_extent._M_extent_value =
       CONCAT71(uStack_19f,bStack_1a0) - (long)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  b_05._M_ptr = (pointer)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  CScript::operator<<((CScript *)local_a8,b_05);
  pvVar3 = (void *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_198 - (long)pvVar3);
  }
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x10c;
  file_09.m_begin = (iterator)&local_3e8;
  msg_09.m_end = pvVar20;
  msg_09.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3f8,
             msg_09);
  rVar8.super_class_property<bool>.value =
       (class_property<bool>)
       ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  _auStack_1e0 = (element_type *)0x0;
  local_1d8.pi_ = (sp_counted_base *)0x0;
  local_4a0._0_8_ = "ExtractDestination(s, address)";
  local_4a0.m_message.px = (element_type *)0xec6ff7;
  bStack_1a0 = false;
  local_1a8._0_4_ = 0x13abc70;
  local_1a8._4_4_ = 0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_408 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_400 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  paStack_190 = &local_4a0;
  local_1e8[0] = rVar8.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar29,
             (size_t)&local_408,0x10c);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1e0 + 8));
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x10d;
  file_10.m_begin = (iterator)&local_418;
  msg_10.m_end = pvVar20;
  msg_10.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_428,
             msg_10);
  pvVar13 = std::
            get<4ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                      ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                        *)&local_f8._M_first);
  auVar25[0] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x10] == (uchar)local_1c8.m_message.pn.pi_);
  auVar25[1] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x11] == local_1c8.m_message.pn.pi_._1_1_);
  auVar25[2] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x12] == local_1c8.m_message.pn.pi_._2_1_);
  auVar25[3] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x13] == local_1c8.m_message.pn.pi_._3_1_);
  auVar25[4] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x14] == local_1c8.m_message.pn.pi_._4_1_);
  auVar25[5] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x15] == local_1c8.m_message.pn.pi_._5_1_);
  auVar25[6] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x16] == local_1c8.m_message.pn.pi_._6_1_);
  auVar25[7] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x17] == local_1c8.m_message.pn.pi_._7_1_);
  auVar25[8] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x18] == uStack_1b0);
  auVar25[9] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                 [0x19] == uStack_1af);
  auVar25[10] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                  [0x1a] == uStack_1ae);
  auVar25[0xb] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1b] == uStack_1ad);
  auVar25[0xc] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1c] == uStack_1ac);
  auVar25[0xd] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1d] == uStack_1ab);
  auVar25[0xe] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1e] == uStack_1aa);
  auVar25[0xf] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0x1f] == uStack_1a9);
  auVar23[0] = -((readonly_property<bool>)
                 (pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[0]
                == local_1c8.p_predicate_value.super_readonly_property<bool>.
                   super_class_property<bool>.value);
  auVar23[1] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[1]
                == local_1c8._1_1_);
  auVar23[2] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[2]
                == local_1c8._2_1_);
  auVar23[3] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[3]
                == local_1c8._3_1_);
  auVar23[4] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[4]
                == local_1c8._4_1_);
  auVar23[5] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[5]
                == local_1c8._5_1_);
  auVar23[6] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[6]
                == local_1c8._6_1_);
  auVar23[7] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[7]
                == local_1c8._7_1_);
  auVar23[8] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[8]
                == (uchar)local_1c8.m_message.px);
  auVar23[9] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems[9]
                == local_1c8.m_message.px._1_1_);
  auVar23[10] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                  [10] == local_1c8.m_message.px._2_1_);
  auVar23[0xb] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0xb] == local_1c8.m_message.px._3_1_);
  auVar23[0xc] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0xc] == local_1c8.m_message.px._4_1_);
  auVar23[0xd] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0xd] == local_1c8.m_message.px._5_1_);
  auVar23[0xe] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0xe] == local_1c8.m_message.px._6_1_);
  auVar23[0xf] = -((pvVar13->super_BaseHash<uint256>).m_hash.super_base_blob<256U>.m_data._M_elems
                   [0xf] == local_1c8.m_message.px._7_1_);
  auVar23 = auVar23 & auVar25;
  _local_1e8 = (undefined **)
               CONCAT71(stack0xfffffffffffffe19,
                        (ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff);
  _auStack_1e0 = (element_type *)0x0;
  local_1d8.pi_ = (sp_counted_base *)0x0;
  local_4a0._0_8_ = "std::get<WitnessV0ScriptHash>(address) == scripthash";
  local_4a0.m_message.px = (element_type *)0xec7103;
  bStack_1a0 = false;
  local_1a8._0_4_ = 0x13abc70;
  local_1a8._4_4_ = 0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_430 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  paStack_190 = &local_4a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar29,
             (size_t)&local_438,0x10d);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1e0 + 8));
  prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,0);
  sVar17 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    sVar17 = uStack_8c;
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,sVar17);
  uVar15 = uStack_8c - 0x1d;
  if (uStack_8c < 0x1d) {
    uVar15 = uStack_8c;
  }
  ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8._0_8_;
  if (uStack_8c < 0x1d) {
    ppVar9 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8;
  }
  local_1a8[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x51;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8,
             (uchar *)((long)&ppVar9->_union + (long)(int)uVar15),local_1a8);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,&local_79);
  b_06._M_extent._M_extent_value =
       CONCAT71(uStack_19f,bStack_1a0) - (long)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  b_06._M_ptr = (pointer)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  CScript::operator<<((CScript *)local_a8,b_06);
  pvVar3 = (void *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_198 - (long)pvVar3);
  }
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x112;
  file_11.m_begin = (iterator)&local_448;
  msg_11.m_end = pvVar20;
  msg_11.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_458,
             msg_11);
  bVar7 = ExtractDestination((CScript *)local_a8,(CTxDestination *)&local_f8._M_first);
  _local_1e8 = (undefined **)CONCAT71(stack0xfffffffffffffe19,bVar7);
  _auStack_1e0 = (element_type *)0x0;
  local_1d8.pi_ = (sp_counted_base *)0x0;
  local_4a0._0_8_ = "ExtractDestination(s, address)";
  local_4a0.m_message.px = (element_type *)0xec6ff7;
  bStack_1a0 = false;
  local_1a8._0_4_ = 0x13abc70;
  local_1a8._4_4_ = 0;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_460 = "";
  pvVar19 = (iterator)0x1;
  pvVar20 = (iterator)0x0;
  paStack_190 = &local_4a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1e8,(lazy_ostream *)local_1a8,1,0,WARN,_cVar29,
             (size_t)&local_468,0x112);
  boost::detail::shared_count::~shared_count((shared_count *)(auStack_1e0 + 8));
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1e8,&local_79);
  local_1a8._0_4_ = 1;
  bStack_1a0 = false;
  uStack_19f = 0;
  local_198 = (pointer)0x0;
  paStack_190 = (assertion_result *)0x0;
  uVar16 = (long)_auStack_1e0 - (long)_local_1e8;
  if (uVar16 == 0) {
    __dest = (pointer)0x0;
  }
  else {
    if ((long)uVar16 < 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar14 = std::__throw_bad_alloc();
        boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
        pvVar3 = (void *)CONCAT71(uStack_19f,bStack_1a0);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,(long)paStack_190 - (long)pvVar3);
        }
        if (0x1c < local_100._4_4_) {
          free((void *)local_118._0_8_);
          local_118._0_8_ = (CScript *)0x0;
        }
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_f8._M_first);
        if (0x1c < uStack_8c) {
          free((void *)local_a8._0_8_);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_a8._8_8_;
          local_a8._0_16_ = auVar5 << 0x40;
        }
        if (local_1f0._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
          SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                    ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_1f0,
                     local_1f0._M_head_impl);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar14);
        }
      }
      goto LAB_005c15f5;
    }
    __dest = (pointer)operator_new(uVar16);
  }
  pp_Var6 = (_func_int **)_local_1e8;
  bStack_1a0 = SUB81(__dest,0);
  uStack_19f = (undefined7)((ulong)__dest >> 8);
  paStack_190 = (assertion_result *)(__dest + uVar16);
  __n = (long)_auStack_1e0 - (long)_local_1e8;
  if (__n != 0) {
    local_198 = __dest;
    memmove(__dest,_local_1e8,__n);
  }
  local_198 = __dest + __n;
  if (pp_Var6 != (_func_int **)0x0) {
    operator_delete(pp_Var6,(long)local_1d8.pi_ - (long)pp_Var6);
  }
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x114;
  file_12.m_begin = (iterator)&local_478;
  msg_12.m_end = pvVar20;
  msg_12.m_begin = pvVar19;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_488,
             msg_12);
  w1 = std::
       get<8ul,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                 ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   *)&local_f8._M_first);
  bVar7 = ::operator==(w1,(WitnessUnknown *)local_1a8);
  local_4a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar7;
  local_4a0.m_message.px = (element_type *)0x0;
  local_4a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d0 = &local_4b0;
  local_4b0 = "std::get<WitnessUnknown>(address) == unk";
  local_4a8 = "";
  _auStack_1e0 = (element_type *)(auStack_1e0._1_8_ << 8);
  _local_1e8 = &PTR__lazy_ostream_013abc70;
  local_1d8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a0,(lazy_ostream *)local_1e8,1,0,WARN,0xec6abf,(size_t)&stack0xfffffffffffffb40
             ,0x114);
  boost::detail::shared_count::~shared_count(&local_4a0.m_message.pn);
  pvVar3 = (void *)CONCAT71(uStack_19f,bStack_1a0);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)paStack_190 - (long)pvVar3);
  }
  if (0x1c < local_100._4_4_) {
    free((void *)local_118._0_8_);
    local_118._0_8_ = (CScript *)0x0;
  }
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_f8._M_first);
  if (0x1c < uStack_8c) {
    free((void *)local_a8._0_8_);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_a8._8_8_;
    local_a8._0_16_ = auVar4 << 0x40;
  }
  if (local_1f0._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_1f0,
               local_1f0._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005c15f5:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_ExtractDestination)
{
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();

    CScript s;
    CTxDestination address;

    // TxoutType::PUBKEY
    s.clear();
    s << ToByteVector(pubkey) << OP_CHECKSIG;
    BOOST_CHECK(!ExtractDestination(s, address));
    BOOST_CHECK(std::get<PubKeyDestination>(address) == PubKeyDestination(pubkey));

    // TxoutType::PUBKEYHASH
    s.clear();
    s << OP_DUP << OP_HASH160 << ToByteVector(pubkey.GetID()) << OP_EQUALVERIFY << OP_CHECKSIG;
    BOOST_CHECK(ExtractDestination(s, address));
    BOOST_CHECK(std::get<PKHash>(address) == PKHash(pubkey));

    // TxoutType::SCRIPTHASH
    CScript redeemScript(s); // initialize with leftover P2PKH script
    s.clear();
    s << OP_HASH160 << ToByteVector(CScriptID(redeemScript)) << OP_EQUAL;
    BOOST_CHECK(ExtractDestination(s, address));
    BOOST_CHECK(std::get<ScriptHash>(address) == ScriptHash(redeemScript));

    // TxoutType::MULTISIG
    s.clear();
    s << OP_1 << ToByteVector(pubkey) << OP_1 << OP_CHECKMULTISIG;
    BOOST_CHECK(!ExtractDestination(s, address));

    // TxoutType::NULL_DATA
    s.clear();
    s << OP_RETURN << std::vector<unsigned char>({75});
    BOOST_CHECK(!ExtractDestination(s, address));

    // TxoutType::WITNESS_V0_KEYHASH
    s.clear();
    s << OP_0 << ToByteVector(pubkey.GetID());
    BOOST_CHECK(ExtractDestination(s, address));
    WitnessV0KeyHash keyhash;
    CHash160().Write(pubkey).Finalize(keyhash);
    BOOST_CHECK(std::get<WitnessV0KeyHash>(address) == keyhash);

    // TxoutType::WITNESS_V0_SCRIPTHASH
    s.clear();
    WitnessV0ScriptHash scripthash;
    CSHA256().Write(redeemScript.data(), redeemScript.size()).Finalize(scripthash.begin());
    s << OP_0 << ToByteVector(scripthash);
    BOOST_CHECK(ExtractDestination(s, address));
    BOOST_CHECK(std::get<WitnessV0ScriptHash>(address) == scripthash);

    // TxoutType::WITNESS_UNKNOWN with unknown version
    s.clear();
    s << OP_1 << ToByteVector(pubkey);
    BOOST_CHECK(ExtractDestination(s, address));
    WitnessUnknown unk{1, ToByteVector(pubkey)};
    BOOST_CHECK(std::get<WitnessUnknown>(address) == unk);
}